

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall Player::ChangePass(Player *this,secure_string *password)

{
  World *pWVar1;
  mapped_type *this_00;
  string *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Database_Result local_110;
  string local_f0;
  allocator<char> local_b9;
  key_type local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  secure_string password_buffer;
  secure_string *password_local;
  Player *this_local;
  
  pWVar1 = this->world;
  password_buffer.str_.field_2._8_8_ = password;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"PasswordSalt",&local_b9);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar1->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_b8);
  util::variant::operator_cast_to_string(&local_98,this_00);
  std::operator+(&local_78,&local_98,&this->username);
  psVar2 = util::secure_string::str_abi_cxx11_((secure_string *)password_buffer.str_.field_2._8_8_);
  std::operator+(&local_58,&local_78,psVar2);
  util::secure_string::secure_string((secure_string *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  psVar2 = util::secure_string::str_abi_cxx11_((secure_string *)local_38);
  sha256(&local_f0,psVar2);
  util::secure_string::operator=((secure_string *)password_buffer.str_.field_2._8_8_,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  util::secure_string::~secure_string((secure_string *)local_38);
  pWVar1 = this->world;
  util::secure_string::str_abi_cxx11_((secure_string *)password_buffer.str_.field_2._8_8_);
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::c_str();
  Database::Query(&local_110,&pWVar1->db,
                  "UPDATE `accounts` SET `password` = \'$\' WHERE username = \'$\'",uVar3,uVar4);
  Database_Result::~Database_Result(&local_110);
  return;
}

Assistant:

void Player::ChangePass(util::secure_string&& password)
{
	{
		util::secure_string password_buffer(std::move(std::string(this->world->config["PasswordSalt"]) + this->username + password.str()));
		password = sha256(password_buffer.str());
	}

	this->world->db.Query("UPDATE `accounts` SET `password` = '$' WHERE username = '$'", password.str().c_str(), this->username.c_str());
}